

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

void freeProxyData(MQTTTRANSPORT_HANDLE_DATA *transport_data)

{
  if (transport_data->http_proxy_hostname != (char *)0x0) {
    free(transport_data->http_proxy_hostname);
    transport_data->http_proxy_hostname = (char *)0x0;
  }
  if (transport_data->http_proxy_username != (char *)0x0) {
    free(transport_data->http_proxy_username);
    transport_data->http_proxy_username = (char *)0x0;
  }
  if (transport_data->http_proxy_password != (char *)0x0) {
    free(transport_data->http_proxy_password);
    transport_data->http_proxy_password = (char *)0x0;
  }
  return;
}

Assistant:

static void freeProxyData(MQTTTRANSPORT_HANDLE_DATA* transport_data)
{
    if (transport_data->http_proxy_hostname != NULL)
    {
        free(transport_data->http_proxy_hostname);
        transport_data->http_proxy_hostname = NULL;
    }

    if (transport_data->http_proxy_username != NULL)
    {
        free(transport_data->http_proxy_username);
        transport_data->http_proxy_username = NULL;
    }

    if (transport_data->http_proxy_password != NULL)
    {
        free(transport_data->http_proxy_password);
        transport_data->http_proxy_password = NULL;
    }
}